

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::torrent_info::info(bdecode_node *__return_storage_ptr__,torrent_info *this,char *key)

{
  bool bVar1;
  type_t tVar2;
  char *start;
  char *pcVar3;
  string_view local_40;
  undefined1 local_30 [8];
  error_code ec;
  char *key_local;
  torrent_info *this_local;
  
  ec.cat_ = (error_category *)key;
  tVar2 = bdecode_node::type(&this->m_info_dict);
  if (tVar2 == none_t) {
    boost::system::error_code::error_code((error_code *)local_30);
    start = boost::shared_array<char>::get(&this->m_info_section);
    pcVar3 = boost::shared_array<char>::get(&this->m_info_section);
    bdecode(start,pcVar3 + this->m_info_section_size,&this->m_info_dict,(error_code *)local_30,
            (int *)0x0,100,2000000);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_30);
    if (bVar1) {
      memset(__return_storage_ptr__,0,0x40);
      bdecode_node::bdecode_node(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,(char *)ec.cat_);
  bdecode_node::dict_find(__return_storage_ptr__,&this->m_info_dict,local_40);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node torrent_info::info(char const* key) const
	{
		if (m_info_dict.type() == bdecode_node::none_t)
		{
			error_code ec;
			bdecode(m_info_section.get(), m_info_section.get()
				+ m_info_section_size, m_info_dict, ec);
			if (ec) return bdecode_node();
		}
		return m_info_dict.dict_find(key);
	}